

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  ImGuiID id;
  ImU32 col;
  undefined7 extraout_var;
  byte bVar9;
  bool bVar10;
  long lVar11;
  uint uVar12;
  byte bVar13;
  float fVar14;
  ImVec2 IVar15;
  undefined8 extraout_XMM0_Qb;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImVec2 ta;
  byte local_ac;
  ImVec2 local_a8;
  undefined4 local_9c;
  ImVec2 local_98;
  uint local_90;
  float local_8c;
  ImGuiWindow *local_88;
  char *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImGuiWindow **local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar15 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_78._8_8_ = extraout_XMM0_Qb;
  local_78._0_4_ = IVar15.x;
  local_78._4_4_ = IVar15.y;
  bVar6 = IsPopupOpen(id);
  if (((this->Flags & 0x4000000) == 0) &&
     (iVar2 = (pIVar5->BeginPopupStack).Size, iVar2 < (pIVar5->OpenPopupStack).Size)) {
    lVar11 = (long)(this->IDStack).Size;
    if (lVar11 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x50d,"T &ImVector<unsigned int>::back() [T = unsigned int]");
    }
    local_88 = pIVar5->NavWindow;
    if ((pIVar5->OpenPopupStack).Data[iVar2].OpenParentId != (this->IDStack).Data[lVar11 + -1])
    goto LAB_0020daa0;
    pIVar5->NavWindow = this;
    local_ac = 1;
  }
  else {
    local_88 = pIVar5->NavWindow;
LAB_0020daa0:
    local_ac = 0;
  }
  local_48 = &pIVar5->NavWindow;
  local_98.x = (this->DC).CursorPos.x;
  fVar14 = (this->DC).CursorPos.y;
  local_58 = ZEXT416((uint)local_98.x);
  local_9c = (undefined4)CONCAT71(extraout_var,bVar6);
  uVar12 = (uint)bVar6;
  local_80 = label;
  if ((this->DC).LayoutType == 0) {
    local_58 = ZEXT416((uint)((local_98.x + -1.0) -
                             (float)(int)((pIVar5->Style).ItemSpacing.x * 0.5)));
    local_68 = ZEXT416((uint)(fVar14 - (pIVar5->Style).FramePadding.y));
    local_98.y = ImGuiWindow::MenuBarHeight(this);
    local_98.y = local_98.y + (float)local_68._0_4_;
    local_98.x = (float)local_58._0_4_;
    fVar14 = (pIVar5->Style).ItemSpacing.x;
    (this->DC).CursorPos.x = (float)(int)(fVar14 * 0.5) + (this->DC).CursorPos.x;
    local_a8.y = (pIVar5->Style).ItemSpacing.y;
    local_a8.x = fVar14 + fVar14;
    PushStyleVar(0xd,&local_a8);
    local_a8.y = 0.0;
    local_a8.x = (float)local_78._0_4_;
    bVar6 = Selectable(label,bVar6,(uint)!enabled * 8 + 0x300001,&local_a8);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar5->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
  }
  else {
    local_98.y = fVar14 - (pIVar5->Style).WindowPadding.y;
    local_68 = ZEXT416((uint)fVar14);
    local_8c = ImGuiMenuColumns::DeclColumns
                         (&(this->DC).MenuColumns,(float)local_78._0_4_,0.0,
                          (float)(int)(pIVar5->FontSize * 1.2));
    IVar15 = GetContentRegionAvail();
    fVar14 = IVar15.x - local_8c;
    local_78 = ZEXT416(~-(uint)(fVar14 <= 0.0) & (uint)fVar14);
    local_a8.y = 0.0;
    local_a8.x = local_8c;
    bVar6 = Selectable(label,bVar6,(uint)!enabled * 8 + 0xb00001,&local_a8);
    col = GetColorU32((uint)!enabled,1.0);
    IVar15.x = (float)local_58._0_4_ +
               pIVar5->FontSize * 0.3 + (float)local_78._0_4_ + (this->DC).MenuColumns.Pos[2];
    IVar15.y = (float)local_68._0_4_ + 0.0;
    RenderArrow(this->DrawList,IVar15,col,1,1.0);
  }
  if (enabled) {
    bVar7 = ItemHoverable(&(this->DC).LastItemRect,id);
  }
  else {
    bVar7 = false;
  }
  bVar13 = (byte)local_9c;
  if (local_ac != 0) {
    *local_48 = local_88;
  }
  if ((this->DC).LayoutType == 1) {
    iVar2 = (pIVar5->BeginPopupStack).Size;
    if ((iVar2 < (pIVar5->OpenPopupStack).Size) &&
       (pIVar3 = (pIVar5->OpenPopupStack).Data, pIVar3[iVar2].SourceWindow == this)) {
      bVar8 = true;
      if (((pIVar5->HoveredWindow == this) &&
          (pIVar4 = pIVar3[iVar2].Window, pIVar4 != (ImGuiWindow *)0x0)) &&
         ((this->Flags & 0x400) == 0)) {
        local_38.x = (pIVar4->Pos).x;
        fVar14 = (pIVar4->Pos).y;
        IVar15 = (pIVar5->IO).MousePos;
        IVar1 = (pIVar5->IO).MouseDelta;
        fVar16 = IVar15.x - IVar1.x;
        local_a8.y = IVar15.y - IVar1.y;
        if (local_38.x < (this->Pos).x || local_38.x == (this->Pos).x) {
          local_38.x = local_38.x + (pIVar4->Size).x;
          fVar19 = 0.5;
        }
        else {
          fVar19 = -0.5;
        }
        fVar17 = ABS(fVar16 - local_38.x) * 0.3;
        fVar18 = 30.0;
        if (fVar17 <= 30.0) {
          fVar18 = fVar17;
        }
        fVar18 = (float)(-(uint)(fVar17 < 5.0) & 0x40a00000 | ~-(uint)(fVar17 < 5.0) & (uint)fVar18)
        ;
        local_a8.x = fVar19 + fVar16;
        fVar16 = (fVar14 - fVar18) - local_a8.y;
        if (fVar16 <= -100.0) {
          fVar16 = -100.0;
        }
        local_38.y = fVar16 + local_a8.y;
        fVar14 = ((pIVar4->Size).y + fVar14 + fVar18) - local_a8.y;
        if (100.0 <= fVar14) {
          fVar14 = 100.0;
        }
        local_40.y = fVar14 + local_a8.y;
        local_40.x = local_38.x;
        local_90 = uVar12;
        bVar10 = ImTriangleContainsPoint(&local_a8,&local_38,&local_40,&(pIVar5->IO).MousePos);
        bVar8 = !bVar10;
        uVar12 = local_90;
      }
    }
    else {
      bVar8 = true;
    }
    bVar9 = bVar13 ^ 1;
    if ((bVar7 == false && bVar9 == 0) && (pIVar5->HoveredWindow == this)) {
      local_ac = pIVar5->HoveredIdPreviousFrame != 0 & bVar8 & pIVar5->HoveredIdPreviousFrame != id;
    }
    else {
      local_ac = 0;
    }
    bVar10 = (bool)(bVar6 & bVar9 & bVar7);
    if (bVar7 == false) {
      bVar8 = bVar10;
    }
    if (bVar13 != 0) {
      bVar8 = bVar10;
    }
    if (bVar6 != false) {
      bVar8 = bVar10;
    }
    if (pIVar5->NavActivateId == id) {
      local_ac = (byte)uVar12;
      bVar8 = bVar9;
    }
    if (((pIVar5->NavId != id) || (pIVar5->NavMoveRequest != true)) ||
       (bVar9 = local_ac, pIVar5->NavMoveDir != 1)) goto LAB_0020de91;
  }
  else {
    if (bVar6 != false) {
      local_ac = local_ac & bVar6 & bVar13;
      bVar13 = bVar13 ^ local_ac;
      bVar8 = local_ac ^ 1;
      goto LAB_0020de91;
    }
    if ((byte)(bVar13 | local_ac & bVar7 ^ 1) != 1) {
      bVar8 = 1;
      bVar13 = 0;
      local_ac = 0;
      goto LAB_0020de91;
    }
    if ((pIVar5->NavId != id) || (pIVar5->NavMoveRequest != true)) {
      bVar8 = 0;
      local_ac = 0;
      goto LAB_0020de91;
    }
    local_ac = 0;
    bVar9 = 0;
    if (pIVar5->NavMoveDir != 3) {
      bVar8 = 0;
      goto LAB_0020de91;
    }
  }
  local_ac = bVar9;
  NavMoveRequestCancel();
  bVar8 = 1;
LAB_0020de91:
  if (((!enabled) || (local_ac != 0)) && (bVar6 = IsPopupOpen(id), bVar6)) {
    ClosePopupToLevel((pIVar5->BeginPopupStack).Size,true);
  }
  if ((((~bVar8 | bVar13) & 1) == 0) &&
     ((pIVar5->BeginPopupStack).Size < (pIVar5->OpenPopupStack).Size)) {
    OpenPopup(local_80);
    return false;
  }
  if ((bVar8 & 1) == 0) {
    if (bVar13 == 0) {
      return false;
    }
  }
  else {
    OpenPopup(local_80);
  }
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  SetNextWindowPos(&local_98,1,&local_a8);
  bVar6 = BeginPopupEx(id,(uint)((this->Flags & 0x14000000U) != 0) << 0x18 | 0x10080145);
  return bVar6;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}